

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::FormattingScene::TransformEnd(FormattingScene *this,FileLoc loc)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar1 = *(int *)&(this->super_SceneRepresentation).field_0xc + -4;
  *(int *)&(this->super_SceneRepresentation).field_0xc = iVar1;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_30,(char)iVar1);
  Printf<std::__cxx11::string>("%sTransformEnd\n",&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FormattingScene::TransformEnd(FileLoc loc) {
    catIndentCount -= 4;
    Printf("%sTransformEnd\n", indent());
}